

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O2

int Abc_CommandAbc9Rpm(Abc_Frame_t *pAbc,int argc,char **argv)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  Gia_Man_t *pGVar4;
  char *pcVar5;
  uint fVeryVerbose;
  char *pcVar6;
  uint local_44;
  uint local_40;
  
  bVar1 = false;
  Extra_UtilGetoptReset();
  local_40 = 0x10;
  local_44 = 0;
  fVeryVerbose = 0;
  while( true ) {
    while( true ) {
      while( true ) {
        while (iVar3 = Extra_UtilGetopt(argc,argv,"Cavwh"), iVar2 = globalUtilOptind, iVar3 == 0x77)
        {
          fVeryVerbose = fVeryVerbose ^ 1;
        }
        if (iVar3 == -1) {
          pGVar4 = pAbc->pGia;
          if (pGVar4 != (Gia_Man_t *)0x0) {
            if (bVar1) {
              pGVar4 = Abs_RpmPerformOld(pGVar4,local_44);
            }
            else {
              pGVar4 = Abs_RpmPerform(pGVar4,local_40,local_44,fVeryVerbose);
            }
            Abc_FrameUpdateGia(pAbc,pGVar4);
            return 0;
          }
          Abc_Print(-1,"Abc_CommandAbc9Rpm(): There is no AIG.\n");
          return 0;
        }
        if (iVar3 != 0x76) break;
        local_44 = local_44 ^ 1;
      }
      if (iVar3 != 0x61) break;
      bVar1 = (bool)(bVar1 ^ 1);
    }
    if (iVar3 != 0x43) goto LAB_002207e9;
    if (argc <= globalUtilOptind) break;
    local_40 = atoi(argv[globalUtilOptind]);
    globalUtilOptind = iVar2 + 1;
    if ((int)local_40 < 0) {
LAB_002207e9:
      Abc_Print(-2,"usage: &rpm [-C num] [-avwh]\n");
      Abc_Print(-2,"\t         performs structural reparametrization\n");
      Abc_Print(-2,"\t-C num : max cut size for testing range equivalence [default = %d]\n",
                (ulong)local_40);
      pcVar6 = "yes";
      pcVar5 = "yes";
      if (!bVar1) {
        pcVar5 = "no";
      }
      Abc_Print(-2,"\t-a     : toggle using old algorithm [default = %s]\n",pcVar5);
      pcVar5 = "yes";
      if (local_44 == 0) {
        pcVar5 = "no";
      }
      Abc_Print(-2,"\t-v     : toggle printing verbose information [default = %s]\n",pcVar5);
      if (fVeryVerbose == 0) {
        pcVar6 = "no";
      }
      Abc_Print(-2,"\t-w     : toggle printing more verbose information [default = %s]\n",pcVar6);
      Abc_Print(-2,"\t-h     : print the command usage\n");
      return 1;
    }
  }
  Abc_Print(-1,"Command line switch \"-C\" should be followed by an integer.\n");
  goto LAB_002207e9;
}

Assistant:

int Abc_CommandAbc9Rpm( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    Gia_Man_t * pTemp;
    int c, nCutMax   = 16;
    int fUseOldAlgo  =  0;
    int fVerbose     =  0;
    int fVeryVerbose =  0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "Cavwh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'C':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-C\" should be followed by an integer.\n" );
                goto usage;
            }
            nCutMax = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nCutMax < 0 )
                goto usage;
            break;
        case 'a':
            fUseOldAlgo ^= 1;
            break;
        case 'v':
            fVerbose ^= 1;
            break;
        case 'w':
            fVeryVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( pAbc->pGia == NULL )
    {
        Abc_Print( -1, "Abc_CommandAbc9Rpm(): There is no AIG.\n" );
        return 0;
    }
    if ( fUseOldAlgo )
        pTemp = Abs_RpmPerformOld( pAbc->pGia, fVerbose );
    else
        pTemp = Abs_RpmPerform( pAbc->pGia, nCutMax, fVerbose, fVeryVerbose );
    Abc_FrameUpdateGia( pAbc, pTemp );
    return 0;

usage:
    Abc_Print( -2, "usage: &rpm [-C num] [-avwh]\n" );
    Abc_Print( -2, "\t         performs structural reparametrization\n" );
    Abc_Print( -2, "\t-C num : max cut size for testing range equivalence [default = %d]\n", nCutMax );
    Abc_Print( -2, "\t-a     : toggle using old algorithm [default = %s]\n", fUseOldAlgo? "yes": "no" );
    Abc_Print( -2, "\t-v     : toggle printing verbose information [default = %s]\n", fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-w     : toggle printing more verbose information [default = %s]\n", fVeryVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    return 1;
}